

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O0

DecodeStatus decodeBDXAddr12Operand(MCInst *Inst,uint64_t Field,uint *Regs)

{
  ulong uVar1;
  uint local_54;
  uint local_44;
  uint64_t Disp;
  uint64_t Base;
  uint64_t Index;
  uint *Regs_local;
  uint64_t Field_local;
  MCInst *Inst_local;
  
  uVar1 = Field >> 0xc & 0xf;
  if (uVar1 == 0) {
    local_44 = 0;
  }
  else {
    local_44 = Regs[uVar1];
  }
  MCOperand_CreateReg0(Inst,local_44);
  MCOperand_CreateImm0(Inst,Field & 0xfff);
  if (Field >> 0x10 == 0) {
    local_54 = 0;
  }
  else {
    local_54 = Regs[Field >> 0x10];
  }
  MCOperand_CreateReg0(Inst,local_54);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus decodeBDXAddr12Operand(MCInst *Inst, uint64_t Field,
		const unsigned *Regs)
{
	uint64_t Index = Field >> 16;
	uint64_t Base = (Field >> 12) & 0xf;
	uint64_t Disp = Field & 0xfff;

	//assert(Index < 16 && "Invalid BDXAddr12");
	MCOperand_CreateReg0(Inst, Base == 0 ? 0 : Regs[Base]);
	MCOperand_CreateImm0(Inst, Disp);
	MCOperand_CreateReg0(Inst, Index == 0 ? 0 : Regs[Index]);

	return MCDisassembler_Success;
}